

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

void __thiscall Assimp::BaseImporter::UpdateImporterScale(BaseImporter *this,Importer *pImp)

{
  double dVar1;
  double dVar2;
  Logger *this_00;
  char *local_1a8;
  char local_198 [16];
  undefined1 local_188 [376];
  
  if (pImp == (Importer *)0x0) {
    __assert_fail("pImp != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x51,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  dVar1 = this->importerScale;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    __assert_fail("importerScale != 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x52,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  dVar2 = this->fileScale;
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    __assert_fail("fileScale != 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x53,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  Importer::SetPropertyFloat(pImp,"APP_SCALE_FACTOR",(float)(dVar1 * dVar2));
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[34]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (char (*) [34])"UpdateImporterScale scale set: %f");
  std::ostream::_M_insert<double>(dVar1 * dVar2);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return;
}

Assistant:

void BaseImporter::UpdateImporterScale( Importer* pImp )
{
    ai_assert(pImp != nullptr);
    ai_assert(importerScale != 0.0);
    ai_assert(fileScale != 0.0);

    double activeScale = importerScale * fileScale;

    // Set active scaling
    pImp->SetPropertyFloat( AI_CONFIG_APP_SCALE_KEY, static_cast<float>( activeScale) );

    ASSIMP_LOG_DEBUG_F("UpdateImporterScale scale set: %f", activeScale );
}